

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

char * __thiscall cmGeneratorTarget::GetCustomObjectExtension(cmGeneratorTarget *this)

{
  bool bVar1;
  int iVar2;
  _Alloc_hider _Var3;
  allocator<char> local_31;
  string local_30;
  
  if (GetCustomObjectExtension()::extension_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetCustomObjectExtension()::extension_abi_cxx11_);
    if (iVar2 != 0) {
      GetCustomObjectExtension()::extension_abi_cxx11_._M_dataplus._M_p =
           (pointer)&GetCustomObjectExtension()::extension_abi_cxx11_.field_2;
      GetCustomObjectExtension()::extension_abi_cxx11_._M_string_length = 0;
      GetCustomObjectExtension()::extension_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,&GetCustomObjectExtension()::extension_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetCustomObjectExtension()::extension_abi_cxx11_);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CUDA_PTX_COMPILATION",&local_31);
  bVar1 = GetPropertyAsBool(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (bVar1) {
    std::__cxx11::string::assign((char *)&GetCustomObjectExtension()::extension_abi_cxx11_);
    _Var3 = GetCustomObjectExtension()::extension_abi_cxx11_._M_dataplus;
  }
  else {
    _Var3._M_p = (char *)0x0;
  }
  return _Var3._M_p;
}

Assistant:

const char* cmGeneratorTarget::GetCustomObjectExtension() const
{
  static std::string extension;
  const bool has_ptx_extension =
    this->GetPropertyAsBool("CUDA_PTX_COMPILATION");
  if (has_ptx_extension) {
    extension = ".ptx";
    return extension.c_str();
  }
  return nullptr;
}